

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

int Hex::Hexdumper<char>::count_identical_lines(char *first,char *last,int unitsperline)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  pair<const_char_*,_const_char_*> thisline;
  pair<const_char_*,_const_char_*> firstline;
  
  firstline.second = first + unitsperline;
  if (last <= first + unitsperline) {
    firstline.second = last;
  }
  iVar2 = 1;
  thisline.first = firstline.second;
  firstline.first = first;
  while( true ) {
    if (last <= thisline.first) {
      return iVar2;
    }
    pcVar3 = thisline.first + unitsperline;
    if (last <= thisline.first + unitsperline) {
      pcVar3 = last;
    }
    thisline.second = pcVar3;
    bVar1 = data_is_equal<std::pair<char_const*,char_const*>>(&firstline,&thisline);
    if (!bVar1) break;
    iVar2 = iVar2 + 1;
    thisline.first = pcVar3;
  }
  return iVar2;
}

Assistant:

static int count_identical_lines(const T*first, const T*last, int unitsperline)
    {
        auto p = first;
        auto pend = std::min(last, p+unitsperline);
        auto firstline = std::make_pair(p, pend);

        int count = 1;

        p = pend;
        while (p<last) {
            auto pend = std::min(last, p+unitsperline);
            auto thisline = std::make_pair(p, pend);

            if (!data_is_equal(firstline, thisline))
                break;

            count++;

            p = pend;
        }

        return count;
    }